

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O3

Limit __thiscall
google::protobuf::io::CodedInputStream::PushLimit(CodedInputStream *this,int byte_limit)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint8_t *puVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  
  iVar1 = this->current_limit_;
  if (-1 < byte_limit) {
    iVar2 = this->total_bytes_read_;
    uVar6 = (iVar2 - this->buffer_size_after_limit_) +
            (*(int *)&this->buffer_ - (int)this->buffer_end_);
    if (((uint)byte_limit <= (uVar6 ^ 0x7fffffff)) && (byte_limit < (int)(iVar1 - uVar6))) {
      iVar7 = uVar6 + byte_limit;
      this->current_limit_ = iVar7;
      puVar4 = this->buffer_end_ + this->buffer_size_after_limit_;
      this->buffer_end_ = puVar4;
      if (this->total_bytes_limit_ < iVar7) {
        iVar7 = this->total_bytes_limit_;
      }
      iVar3 = iVar2 - iVar7;
      iVar5 = 0;
      if (iVar3 != 0 && iVar7 <= iVar2) {
        this->buffer_end_ = puVar4 + -(long)iVar3;
        iVar5 = iVar3;
      }
      this->buffer_size_after_limit_ = iVar5;
    }
  }
  return iVar1;
}

Assistant:

CodedInputStream::Limit CodedInputStream::PushLimit(int byte_limit) {
  // Current position relative to the beginning of the stream.
  int current_position = CurrentPosition();

  Limit old_limit = current_limit_;

  // security: byte_limit is possibly evil, so check for negative values
  // and overflow. Also check that the new requested limit is before the
  // previous limit; otherwise we continue to enforce the previous limit.
  if (ABSL_PREDICT_TRUE(byte_limit >= 0 &&
                        byte_limit <= INT_MAX - current_position &&
                        byte_limit < current_limit_ - current_position)) {
    current_limit_ = current_position + byte_limit;
    RecomputeBufferLimits();
  }

  return old_limit;
}